

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

DirHandle * getRealDirHandle(char *_fname)

{
  void *pvVar1;
  _func_int_void_ptr_char_ptr_PHYSFS_Stat_ptr *p_Var2;
  undefined8 uVar3;
  int iVar4;
  size_t sVar5;
  ulong *puVar6;
  ulong *puVar7;
  __PHYSFS_DIRHANDLE__ *h;
  DirHandle *pDVar8;
  char *dst;
  bool bVar9;
  ulong uStack_68;
  undefined1 local_60 [8];
  PHYSFS_Stat statbuf;
  char *arcfname;
  
  puVar7 = &uStack_68;
  if (_fname == (char *)0x0) {
    PHYSFS_setErrorCode(PHYSFS_ERR_INVALID_ARGUMENT);
  }
  else {
    __PHYSFS_platformGrabMutex(stateLock);
    sVar5 = strlen(_fname);
    if (sVar5 + longest_root + 1 < 0x100) {
      puVar6 = (ulong *)((long)&uStack_68 - (longest_root + sVar5 + 0x18 & 0xfffffffffffffff0));
      puVar7 = puVar6;
    }
    else {
      puVar6 = (ulong *)0x0;
    }
    bVar9 = puVar6 == (ulong *)0x0;
    if (bVar9) {
      puVar7[-1] = 0x108b7f;
      puVar6 = (ulong *)(*__PHYSFS_AllocatorHooks.Malloc)(longest_root + sVar5 + 9);
    }
    if (puVar6 == (ulong *)0x0) {
      puVar6 = (ulong *)0x0;
    }
    else {
      *puVar6 = (ulong)bVar9;
      puVar6 = puVar6 + 1;
    }
    if (puVar6 != (ulong *)0x0) {
      dst = (char *)(longest_root + (long)puVar6);
      puVar7[-1] = 0x108bb3;
      iVar4 = sanitizePlatformIndependentPath(_fname,dst);
      pDVar8 = (DirHandle *)0x0;
      if (searchPath != (DirHandle *)0x0 && iVar4 != 0) {
        h = searchPath;
        do {
          statbuf._32_8_ = dst;
          puVar7[-1] = 0x108bdf;
          iVar4 = partOfMountPoint(h,dst);
          if (iVar4 == 0) {
            puVar7[-1] = 0x108bf7;
            iVar4 = verifyPath(h,(char **)&statbuf.filetype,0);
            uVar3 = statbuf._32_8_;
            if (iVar4 == 0) {
              bVar9 = true;
            }
            else {
              pvVar1 = h->opaque;
              p_Var2 = h->funcs->stat;
              puVar7[-1] = 0x108c0f;
              iVar4 = (*p_Var2)(pvVar1,(char *)uVar3,(PHYSFS_Stat *)local_60);
              bVar9 = iVar4 == 0;
              if (!bVar9) {
                pDVar8 = h;
              }
            }
          }
          else {
            bVar9 = false;
            pDVar8 = h;
          }
        } while ((bVar9) && (h = h->next, h != (__PHYSFS_DIRHANDLE__ *)0x0));
      }
      puVar7[-1] = 0x108c36;
      __PHYSFS_platformReleaseMutex(stateLock);
      if (puVar6[-1] == 0) {
        return pDVar8;
      }
      puVar7[-1] = 0x108c4a;
      (*__PHYSFS_AllocatorHooks.Free)(puVar6 + -1);
      return pDVar8;
    }
    puVar7[-1] = 0x108c56;
    PHYSFS_setErrorCode(PHYSFS_ERR_OUT_OF_MEMORY);
    puVar7[-1] = 0x108c62;
    __PHYSFS_platformReleaseMutex(stateLock);
  }
  return (DirHandle *)0x0;
}

Assistant:

static DirHandle *getRealDirHandle(const char *_fname)
{
    DirHandle *retval = NULL;
    char *allocated_fname = NULL;
    char *fname = NULL;
    size_t len;

    BAIL_IF(!_fname, PHYSFS_ERR_INVALID_ARGUMENT, NULL);

    __PHYSFS_platformGrabMutex(stateLock);
    len = strlen(_fname) + longest_root + 1;
    allocated_fname = __PHYSFS_smallAlloc(len);
    BAIL_IF_MUTEX(!allocated_fname, PHYSFS_ERR_OUT_OF_MEMORY, stateLock, NULL);
    fname = allocated_fname + longest_root;
    if (sanitizePlatformIndependentPath(_fname, fname))
    {
        DirHandle *i;
        for (i = searchPath; i != NULL; i = i->next)
        {
            char *arcfname = fname;
            if (partOfMountPoint(i, arcfname))
            {
                retval = i;
                break;
            } /* if */
            else if (verifyPath(i, &arcfname, 0))
            {
                PHYSFS_Stat statbuf;
                if (i->funcs->stat(i->opaque, arcfname, &statbuf))
                {
                    retval = i;
                    break;
                } /* if */
            } /* if */
        } /* for */
    } /* if */

    __PHYSFS_platformReleaseMutex(stateLock);
    __PHYSFS_smallFree(allocated_fname);
    return retval;
}